

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O0

ProfilerPrintFormat __thiscall
duckdb::QueryProfiler::GetPrintFormat(QueryProfiler *this,ExplainFormat format)

{
  ClientConfig *pCVar1;
  undefined8 uVar2;
  char in_SIL;
  undefined8 *in_RDI;
  ProfilerPrintFormat print_format;
  ExplainFormat in_stack_ffffffffffffff9f;
  allocator local_39;
  string local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  NotImplementedException *in_stack_ffffffffffffffe0;
  ProfilerPrintFormat local_1;
  
  pCVar1 = ClientConfig::GetConfig((ClientContext *)*in_RDI);
  local_1 = pCVar1->profiler_print_format;
  if (in_SIL != '\0') {
    switch(in_SIL) {
    case '\x01':
      local_1 = QUERY_TREE;
      break;
    case '\x02':
      local_1 = JSON;
      break;
    case '\x03':
      local_1 = HTML;
      break;
    case '\x04':
      local_1 = GRAPHVIZ;
      break;
    default:
      uVar2 = __cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_38,"No mapping from ExplainFormat::%s to ProfilerPrintFormat",&local_39);
      EnumUtil::ToString<duckdb::ExplainFormat>(in_stack_ffffffffffffff9f);
      NotImplementedException::NotImplementedException<std::__cxx11::string>
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      __cxa_throw(uVar2,&NotImplementedException::typeinfo,
                  NotImplementedException::~NotImplementedException);
    }
  }
  return local_1;
}

Assistant:

ProfilerPrintFormat QueryProfiler::GetPrintFormat(ExplainFormat format) const {
	auto print_format = ClientConfig::GetConfig(context).profiler_print_format;
	if (format == ExplainFormat::DEFAULT) {
		return print_format;
	}
	switch (format) {
	case ExplainFormat::TEXT:
		return ProfilerPrintFormat::QUERY_TREE;
	case ExplainFormat::JSON:
		return ProfilerPrintFormat::JSON;
	case ExplainFormat::HTML:
		return ProfilerPrintFormat::HTML;
	case ExplainFormat::GRAPHVIZ:
		return ProfilerPrintFormat::GRAPHVIZ;
	default:
		throw NotImplementedException("No mapping from ExplainFormat::%s to ProfilerPrintFormat",
		                              EnumUtil::ToString(format));
	}
}